

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckCloseWithNaNFails::RunImpl(TestCheckCloseWithNaNFails *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_90;
  int local_6c [5];
  TestDetails local_58;
  float local_38;
  float local_34;
  undefined1 local_30 [8];
  TestResults results;
  uint bitpattern;
  TestCheckCloseWithNaNFails *this_local;
  
  results.m_currentTestFailed = true;
  results._21_3_ = 0xffffff;
  UnitTest::TestResults::TestResults((TestResults *)local_30,(TestReporter *)0x0);
  local_34 = 3.0;
  local_38 = 0.1;
  UnitTest::TestDetails::TestDetails(&local_58,"","","",0);
  UnitTest::CheckClose<float,float,float>
            ((TestResults *)local_30,&local_34,(float *)&results.m_currentTestFailed,&local_38,
             &local_58);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_6c[1] = 1;
  local_6c[0] = UnitTest::TestResults::GetFailureCount((TestResults *)local_30);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_90,*ppTVar2,0x82);
  UnitTest::CheckEqual<int,int>(results_00,local_6c + 1,local_6c,&local_90);
  return;
}

Assistant:

TEST(CheckCloseWithNaNFails)
{
    union
    {
        unsigned int bitpattern;
        float nan;
    };
    bitpattern = 0xFFFFFFFF;
    TestResults results;
    CheckClose(results, 3.0f, nan, 0.1f, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}